

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void ppc_store_sdr1_ppc64(CPUPPCState_conflict2 *env,target_ulong value)

{
  if ((env->mmu_model & 0x10000) != POWERPC_MMU_UNKNOWN) {
    if (0x1c < ((uint)value & 0x1f)) {
      return;
    }
    value = value & 0xffffffffffc001f;
  }
  env->spr[0x19] = value;
  return;
}

Assistant:

void ppc_store_sdr1(CPUPPCState *env, target_ulong value)
{
#if 0
    PowerPCCPU *cpu = env_archcpu(env);
    qemu_log_mask(CPU_LOG_MMU, "%s: " TARGET_FMT_lx "\n", __func__, value);
    assert(!cpu->vhyp);
#endif
#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        target_ulong sdr_mask = SDR_64_HTABORG | SDR_64_HTABSIZE;
        target_ulong htabsize = value & SDR_64_HTABSIZE;

        if (value & ~sdr_mask) {
#if 0
            error_report("Invalid bits 0x"TARGET_FMT_lx" set in SDR1",
                         value & ~sdr_mask);
#endif
            value &= sdr_mask;
        }
        if (htabsize > 28) {
#if 0
            error_report("Invalid HTABSIZE 0x" TARGET_FMT_lx" stored in SDR1",
                         htabsize);
#endif
            return;
        }
    }
#endif /* defined(TARGET_PPC64) */
    /* FIXME: Should check for valid HTABMASK values in 32-bit case */
    env->spr[SPR_SDR1] = value;
}